

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

field_type __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
::count(btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
        *this)

{
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  bVar1;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  bVar2;
  field_type fVar3;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string_view<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string_view<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  bVar1 = this[10];
  bVar2 = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
           )start(this);
  if ((byte)bVar2 <= (byte)bVar1) {
    bVar1 = this[10];
    fVar3 = start(this);
    return (char)bVar1 - fVar3;
  }
  __assert_fail("finish() >= start()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                ,0x2ba,
                "field_type absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>>::count() const [Params = absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>]"
               );
}

Assistant:

field_type count() const {
    assert(finish() >= start());
    return finish() - start();
  }